

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TIFFImageHandler.cpp
# Opt level: O2

TiffImageInfo * __thiscall
TIFFImageHandler::ReadImageInfo
          (TiffImageInfo *__return_storage_ptr__,TIFFImageHandler *this,
          IByteReaderWithPosition *inTIFFStream,unsigned_long inImageIndex)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  T2P *pTVar5;
  DoubleAndDoublePair DVar6;
  int iVar7;
  EStatusCode EVar8;
  undefined4 extraout_var;
  TIFF *tif;
  Trace *pTVar9;
  StreamWithPos streamInfo;
  
  (__return_storage_ptr__->dimensions).first = -1.0;
  (__return_storage_ptr__->dimensions).second = -1.0;
  __return_storage_ptr__->colorComponents = 0;
  TIFFSetErrorHandler(ReportError);
  TIFFSetWarningHandler(ReportWarning);
  streamInfo.mStream = inTIFFStream;
  iVar7 = (*(inTIFFStream->super_IByteReader)._vptr_IByteReader[6])(inTIFFStream);
  streamInfo.mOriginalPosition = CONCAT44(extraout_var,iVar7);
  tif = TIFFClientOpen("Stream","r",&streamInfo,STATIC_streamRead,STATIC_streamWrite,
                       STATIC_streamSeek,STATIC_streamClose,STATIC_tiffSize,STATIC_tiffMap,
                       STATIC_tiffUnmap);
  if (tif == (TIFF *)0x0) {
    pTVar9 = Trace::DefaultTrace();
    Trace::TraceToLog(pTVar9,"TIFFImageHandler::ReadImageDimensions. cannot open stream for reading"
                     );
  }
  else {
    InitializeConversionState(this);
    pTVar5 = this->mT2p;
    pTVar5->input = tif;
    std::__cxx11::string::assign((char *)&pTVar5->inputFilePath);
    this->mT2p->pdf_page = (tdir_t)inImageIndex;
    EVar8 = ReadTopLevelTiffInformation(this);
    if (EVar8 == eSuccess) {
      if (this->mT2p->pdf_page < this->mT2p->tiff_pagecount) {
        EVar8 = ReadTIFFPageInformation(this);
        if (EVar8 == eSuccess) {
          pTVar5 = this->mT2p;
          uVar1 = (pTVar5->pdf_mediabox).x1;
          uVar3 = (pTVar5->pdf_mediabox).y1;
          uVar2 = (pTVar5->pdf_mediabox).x2;
          uVar4 = (pTVar5->pdf_mediabox).y2;
          DVar6.second._0_4_ = SUB84((double)((float)uVar4 - (float)uVar3),0);
          DVar6.first = (double)((float)uVar2 - (float)uVar1);
          DVar6.second._4_4_ = (int)((ulong)(double)((float)uVar4 - (float)uVar3) >> 0x20);
          __return_storage_ptr__->dimensions = DVar6;
          __return_storage_ptr__->colorComponents = (uint)pTVar5->tiff_samplesperpixel;
        }
      }
      else {
        pTVar9 = Trace::DefaultTrace();
        pTVar5 = this->mT2p;
        Trace::TraceToLog(pTVar9,
                          "TIFFImageHandler::ReadImageDimensions, Requested tiff page %u where the tiff only has %u pages. Tiff file name - %s"
                          ,(ulong)pTVar5->pdf_page,(ulong)pTVar5->tiff_pagecount,
                          (pTVar5->inputFilePath)._M_dataplus._M_p);
      }
    }
  }
  DestroyConversionState(this);
  if (tif != (TIFF *)0x0) {
    TIFFClose(tif);
  }
  return __return_storage_ptr__;
}

Assistant:

TIFFImageHandler::TiffImageInfo TIFFImageHandler::ReadImageInfo(IByteReaderWithPosition* inTIFFStream,unsigned long inImageIndex)
{
	TIFF* input = NULL;
    TiffImageInfo imageInfo;
	
	imageInfo.dimensions.first = -1;
	imageInfo.dimensions.second = -1;
	imageInfo.colorComponents = 0;
    EStatusCode status;
    
	do
	{
		TIFFSetErrorHandler(ReportError);
		TIFFSetWarningHandler(ReportWarning);
        
		StreamWithPos streamInfo;
		streamInfo.mStream = inTIFFStream;
		streamInfo.mOriginalPosition = inTIFFStream->GetCurrentPosition();
		
		input = TIFFClientOpen("Stream","r",(thandle_t)&streamInfo,STATIC_streamRead,
                               STATIC_streamWrite,
                               STATIC_streamSeek,
                               STATIC_streamClose,
                               STATIC_tiffSize,
                               STATIC_tiffMap,
                               STATIC_tiffUnmap);
		if(!input)
		{
			TRACE_LOG("TIFFImageHandler::ReadImageDimensions. cannot open stream for reading");
			break;
		}
        
        
		InitializeConversionState();
		mT2p->input = input;
		mT2p->inputFilePath = "";
		mT2p->pdf_page = (tdir_t)inImageIndex;
        
        
        status = ReadTopLevelTiffInformation();
        if(status != PDFHummus::eSuccess)
            break;
            
        if(mT2p->pdf_page >= mT2p->tiff_pagecount)
        {
            TRACE_LOG3(
                           "TIFFImageHandler::ReadImageDimensions, Requested tiff page %u where the tiff only has %u pages. Tiff file name - %s",
                           mT2p->pdf_page,
                           mT2p->tiff_pagecount,
                           mT2p->inputFilePath.c_str());
            status = PDFHummus::eFailure;
            break;
        }
        
        status = ReadTIFFPageInformation();
        if(status != PDFHummus::eSuccess)
            break;
        imageInfo.dimensions.first = mT2p->pdf_mediabox.x2 - mT2p->pdf_mediabox.x1;
        imageInfo.dimensions.second = mT2p->pdf_mediabox.y2 - mT2p->pdf_mediabox.y1;
		imageInfo.colorComponents = mT2p->tiff_samplesperpixel;
		      
	}while(false);
    
	DestroyConversionState();
	if(input != NULL)
		TIFFClose(input);
    
    return imageInfo;
}